

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O3

void onDataServer(Ptr *ss,Ptr *buff,size_t n)

{
  size_t *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Codecc *this;
  TCPSocket *this_00;
  undefined1 auVar3 [8];
  bool bVar4;
  any *paVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ClosureTask *this_02;
  int iVar6;
  undefined1 local_90 [8];
  pair<std::shared_ptr<hwnet::Buffer>,_int> ret;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  ClosureTask *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  element_type *local_38;
  
  paVar5 = hwnet::TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  this = (Codecc *)paVar5->content[1]._vptr_placeholder;
  psVar1 = &this->w;
  *psVar1 = *psVar1 + n;
  do {
    bVar4 = hwnet::TCPSocket::IsClosed
                      ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      );
    if (bVar4) {
      return;
    }
    Codecc::Decode((pair<std::shared_ptr<hwnet::Buffer>,_int> *)local_90,this);
    auVar3 = local_90;
    if ((int)ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == 0) {
      if (local_90 == (undefined1  [8])0x0) {
        iVar6 = 2;
      }
      else {
        if (ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->buff).
                      super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->buff).
                        super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
              UNLOCK();
              goto LAB_00111a22;
            }
          }
          else {
            p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->buff).
                      super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
          }
          p_Var2 = &((ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
        }
LAB_00111a22:
        local_38 = ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48 = (ClosureTask *)0x0;
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        (this_01._M_pi)->_M_use_count = 1;
        (this_01._M_pi)->_M_weak_count = 1;
        (this_01._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001264e8;
        local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_68._M_unused._M_object = operator_new(0x18);
        this_02 = (ClosureTask *)(this_01._M_pi + 1);
        *(undefined1 (*) [8])local_68._M_unused._0_8_ = auVar3;
        *(element_type **)((long)local_68._M_unused._0_8_ + 8) = local_38;
        local_50 = std::
                   _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:103:28)_()>_>
                   ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:103:28)_()>_>
                   ::_M_manager;
        hwnet::ClosureTask::ClosureTask(this_02,(Callback *)&local_68);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        if ((this_01._M_pi[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
           (*(int *)(this_01._M_pi[2]._vptr__Sp_counted_base + 1) == 0)) {
          *(ClosureTask **)&this_01._M_pi[1]._M_use_count = this_02;
          local_48 = this_02;
          _Stack_40._M_pi = this_01._M_pi;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(this_01._M_pi + 2),&_Stack_40);
          this_01._M_pi = _Stack_40._M_pi;
          this_02 = local_48;
        }
        local_48 = (ClosureTask *)0x0;
        _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ret._16_8_ = this_02;
        hwnet::ThreadPool::TaskQueue::PostTask(&mainThread.queue_,(Ptr *)&ret.second);
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
        }
        iVar6 = 0;
        if (local_38 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
      }
    }
    else {
      iVar6 = 1;
      hwnet::TCPSocket::Close
                ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    if (ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        this_00 = (ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        Codecc::GetRecvBuffer((Codecc *)&local_68);
        hwnet::TCPSocket::Recv(this_00,(Ptr *)&local_68);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void onDataServer(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	//bytes += n;
	//printf("onData server\n");
	Codecc *code = any_cast<Codecc*>(ss->GetUserData());
	code->onData(n);
	for( ; ; ) {
		if(ss->IsClosed()) return;
		std::pair<Buffer::Ptr,int> ret = code->Decode();
		if(ret.second == 0) {
			if(ret.first != nullptr) {
				auto msg = ret.first;
				mainThread.PostClosure([msg](){
					ccount++;
					std::vector<TCPSocket::Ptr>::iterator it = clients.begin();
					std::vector<TCPSocket::Ptr>::iterator end = clients.end();
					for( ; it != end; it++){
						(*it)->Send(msg);
						count++;
					}
				});
			} else {
				break;
			}
		} else {
			ss->Close();
			return;
		}
	}
	ss->Recv(code->GetRecvBuffer());
}